

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocket::~QSslSocket(QSslSocket *this)

{
  long lVar1;
  long *plVar2;
  
  *(undefined ***)&(this->super_QTcpSocket).super_QAbstractSocket = &PTR_metaObject_002cfa08;
  lVar1 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  plVar2 = *(long **)(lVar1 + 0x3f8);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x20))();
  }
  *(undefined8 *)(lVar1 + 0x3f8) = 0;
  QTcpSocket::~QTcpSocket(&this->super_QTcpSocket);
  return;
}

Assistant:

QSslSocket::~QSslSocket()
{
    Q_D(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::~QSslSocket(), this =" << (void *)this;
#endif
    delete d->plainSocket;
    d->plainSocket = nullptr;
}